

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
cnn::Hinge::forward_impl
          (Hinge *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  PointerType pfVar1;
  size_type sVar2;
  Index IVar3;
  Scalar *pSVar4;
  float *pfVar5;
  long in_RDX;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *in_RSI;
  MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0> *in_RDI;
  uint i;
  real mlystar;
  float *eloss;
  float y;
  uint rows;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> x;
  float in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  uint uVar6;
  undefined4 in_stack_ffffffffffffffb4;
  float fVar7;
  float fVar8;
  float local_40;
  Tensor *in_stack_ffffffffffffffc8;
  
  sVar2 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::size(in_RSI);
  if (sVar2 == 1) {
    std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](in_RSI,0);
    Tensor::operator*(in_stack_ffffffffffffffc8);
    IVar3 = Eigen::
            MapBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>
            ::rows(in_RDI);
    local_40 = 0.0;
    pfVar1 = in_RDI[3].m_data;
    fVar8 = *(float *)&in_RDI[4].m_data;
    pSVar4 = Eigen::
             DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
             ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                           *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    fVar8 = fVar8 - *pSVar4;
    for (uVar6 = 0; uVar6 < (uint)IVar3; uVar6 = uVar6 + 1) {
      if (*(uint *)in_RDI[3].m_cols.m_value == uVar6) {
        pfVar1[uVar6] = 0.0;
      }
      else {
        fVar7 = fVar8;
        pSVar4 = Eigen::
                 DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                               *)CONCAT44(fVar8,uVar6),(ulong)(uint)in_stack_ffffffffffffffa8);
        in_stack_ffffffffffffffa8 = fVar8 + *pSVar4;
        pfVar5 = std::max<float>((float *)&stack0xffffffffffffffac,(float *)&stack0xffffffffffffffa8
                                );
        pfVar1[uVar6] = *pfVar5;
        local_40 = pfVar1[uVar6] + local_40;
        fVar8 = fVar7;
      }
    }
    **(float **)(in_RDX + 0x28) = local_40;
    return;
  }
  __assert_fail("xs.size() == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes.cc"
                ,0x3f6,
                "virtual void cnn::Hinge::forward_impl(const vector<const Tensor *> &, Tensor &) const"
               );
}

Assistant:

void Hinge::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
  assert(xs.size() == 1);
#ifdef HAVE_CUDA
  throw std::runtime_error("Hinge not yet implemented for CUDA");
#else
  auto x = **xs[0];
  const unsigned rows = x.rows();
  float y = 0;
  float* eloss = static_cast<float*>(aux_mem);
  const real mlystar = margin - x(*pelement);
  for (unsigned i = 0; i < rows; ++i) {
    if (*pelement != i) {
      eloss[i] = max(0.f, mlystar + x(i));
      y += eloss[i];
    } else {
      eloss[i] = 0;
    }
  }
  fx.v[0] = y;
#endif
}